

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O2

int sp_symetree(int *acolst,int *acolend,int *arow,int n,int *parent)

{
  int iVar1;
  int *addr;
  int *pp;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int local_50;
  
  addr = mxCallocInt(n);
  pp = mxCallocInt(n);
  uVar5 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    iVar4 = (int)uVar5;
    pp[uVar5] = iVar4;
    addr[uVar5] = iVar4;
    parent[uVar5] = n;
    local_50 = iVar4;
    for (lVar3 = (long)acolst[uVar5]; lVar3 < acolend[uVar5]; lVar3 = lVar3 + 1) {
      if ((long)arow[lVar3] < (long)uVar5) {
        iVar1 = find(arow[lVar3],pp);
        if (uVar5 != (uint)addr[iVar1]) {
          parent[addr[iVar1]] = iVar4;
          pp[local_50] = iVar1;
          addr[iVar1] = iVar4;
          local_50 = iVar1;
        }
      }
    }
  }
  superlu_free(addr);
  superlu_free(pp);
  return 0;
}

Assistant:

int sp_symetree(
                const int *acolst, const int *acolend, /* column starts and ends past 1 */
                const int *arow,            /* row indices of A */
                int n,                /* dimension of A */
                int *parent)    /* parent in elim tree */
{
	int	*root;		    /* root of subtree of etree 	*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (n);
	initialize_disjoint_sets (n, &pp);

	for (col = 0; col < n; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = n; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}
	SUPERLU_FREE (root);
	finalize_disjoint_sets (pp);
	return 0;
}